

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void testing::internal::PrintCharAndCodeTo<wchar_t>(wchar_t c,ostream *os)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  ostream *poVar5;
  uint32_t value;
  char *pcVar6;
  string sStack_48;
  
  poVar5 = std::operator<<(os,"L");
  std::operator<<(poVar5,"\'");
  switch(c) {
  case L'\0':
    pcVar6 = "\\0";
    break;
  case L'\x01':
  case L'\x02':
  case L'\x03':
  case L'\x04':
  case L'\x05':
  case L'\x06':
switchD_001217ad_caseD_1:
    if (0x5e < (uint)(c + L'\xffffffe0')) {
      uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
      poVar5 = std::operator<<(os,"\\x");
      lVar2 = *(long *)poVar5;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar5 + lVar3 + 0x18) = *(uint *)(poVar5 + lVar3 + 0x18) & 0xffffffb5 | 8;
      *(uint *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
      std::ostream::operator<<(poVar5,c);
      *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
      bVar4 = true;
      goto LAB_00121838;
    }
    std::operator<<(os,(char)c);
    goto LAB_00121836;
  case L'\a':
    pcVar6 = "\\a";
    break;
  case L'\b':
    pcVar6 = "\\b";
    break;
  case L'\t':
    pcVar6 = "\\t";
    break;
  case L'\n':
    pcVar6 = "\\n";
    break;
  case L'\v':
    pcVar6 = "\\v";
    break;
  case L'\f':
    pcVar6 = "\\f";
    break;
  case L'\r':
    pcVar6 = "\\r";
    break;
  default:
    if (c == L'\'') {
      pcVar6 = "\\\'";
    }
    else {
      if (c != L'\\') goto switchD_001217ad_caseD_1;
      pcVar6 = "\\\\";
    }
  }
  std::operator<<(os,pcVar6);
LAB_00121836:
  bVar4 = false;
LAB_00121838:
  std::operator<<(os,"\'");
  if (c != L'\0') {
    poVar5 = std::operator<<(os," (");
    std::ostream::operator<<(poVar5,c);
    if (9 < (uint)c && !bVar4) {
      poVar5 = std::operator<<(os,", 0x");
      String::FormatHexUInt32_abi_cxx11_(&sStack_48,(String *)(ulong)(uint)c,value);
      std::operator<<(poVar5,(string *)&sStack_48);
      std::__cxx11::string::~string((string *)&sStack_48);
    }
    std::operator<<(os,")");
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << GetCharWidthPrefix(c) << "'";
  const CharFormat format = PrintAsCharLiteralTo(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0) return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexadecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<int>(c));
  }
  *os << ")";
}